

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distinct_aggregate_data.cpp
# Opt level: O2

idx_t __thiscall
duckdb::DistinctAggregateCollectionInfo::CreateTableIndexMap(DistinctAggregateCollectionInfo *this)

{
  pointer puVar1;
  pointer prVar2;
  const_reference this_00;
  pointer this_01;
  BoundAggregateExpression *pBVar3;
  __normal_iterator<std::reference_wrapper<duckdb::BoundAggregateExpression>_*,_std::vector<std::reference_wrapper<duckdb::BoundAggregateExpression>,_std::allocator<std::reference_wrapper<duckdb::BoundAggregateExpression>_>_>_>
  _Var4;
  unsigned_long uVar5;
  mapped_type *pmVar6;
  unsafe_vector<idx_t> *__range1;
  long lVar7;
  unsigned_long *agg_idx;
  pointer __k;
  vector<std::reference_wrapper<duckdb::BoundAggregateExpression>,_true> table_inputs;
  _Vector_base<std::reference_wrapper<duckdb::BoundAggregateExpression>,_std::allocator<std::reference_wrapper<duckdb::BoundAggregateExpression>_>_>
  local_58;
  reference_wrapper<duckdb::BoundAggregateExpression> local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish =
       (reference_wrapper<duckdb::BoundAggregateExpression> *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (this->indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__k = (this->indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start; __k != puVar1; __k = __k + 1) {
    this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>(this->aggregates,*__k);
    this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(this_00);
    pBVar3 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&this_01->super_BaseExpression);
    _Var4 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::BoundAggregateExpression>*,std::vector<std::reference_wrapper<duckdb::BoundAggregateExpression>,std::allocator<std::reference_wrapper<duckdb::BoundAggregateExpression>>>>,__gnu_cxx::__ops::_Iter_pred<duckdb::FindMatchingAggregate>>
                      (local_58._M_impl.super__Vector_impl_data._M_start,
                       local_58._M_impl.super__Vector_impl_data._M_finish,pBVar3);
    prVar2 = local_58._M_impl.super__Vector_impl_data._M_start;
    if (_Var4._M_current == local_58._M_impl.super__Vector_impl_data._M_finish) {
      pmVar6 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->table_map,__k);
      *pmVar6 = (long)_Var4._M_current - (long)prVar2 >> 3;
      local_38._M_data = pBVar3;
      ::std::
      vector<std::reference_wrapper<duckdb::BoundAggregateExpression>,std::allocator<std::reference_wrapper<duckdb::BoundAggregateExpression>>>
      ::emplace_back<std::reference_wrapper<duckdb::BoundAggregateExpression>>
                ((vector<std::reference_wrapper<duckdb::BoundAggregateExpression>,std::allocator<std::reference_wrapper<duckdb::BoundAggregateExpression>>>
                  *)&local_58,&local_38);
    }
    else {
      uVar5 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                        ((long)_Var4._M_current -
                         (long)local_58._M_impl.super__Vector_impl_data._M_start >> 3);
      pmVar6 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->table_map,__k);
      *pmVar6 = uVar5;
    }
  }
  lVar7 = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
          (long)local_58._M_impl.super__Vector_impl_data._M_start;
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::BoundAggregateExpression>,_std::allocator<std::reference_wrapper<duckdb::BoundAggregateExpression>_>_>
  ::~_Vector_base(&local_58);
  return lVar7 >> 3;
}

Assistant:

idx_t DistinctAggregateCollectionInfo::CreateTableIndexMap() {
	vector<aggr_ref_t> table_inputs;

	D_ASSERT(table_map.empty());
	for (auto &agg_idx : indices) {
		D_ASSERT(agg_idx < aggregates.size());
		auto &aggregate = aggregates[agg_idx]->Cast<BoundAggregateExpression>();

		auto matching_inputs =
		    std::find_if(table_inputs.begin(), table_inputs.end(), FindMatchingAggregate(std::ref(aggregate)));
		if (matching_inputs != table_inputs.end()) {
			//! Assign the existing table to the aggregate
			auto found_idx = NumericCast<idx_t>(std::distance(table_inputs.begin(), matching_inputs));
			table_map[agg_idx] = found_idx;
			continue;
		}
		//! Create a new table and assign its index to the aggregate
		table_map[agg_idx] = table_inputs.size();
		table_inputs.push_back(std::ref(aggregate));
	}
	//! Every distinct aggregate needs to be assigned an index
	D_ASSERT(table_map.size() == indices.size());
	//! There can not be more tables than there are distinct aggregates
	D_ASSERT(table_inputs.size() <= indices.size());

	return table_inputs.size();
}